

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pointer __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
::iterator::operator->(iterator *this)

{
  slot_type *psVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  uint uVar4;
  ctrl_t cVar5;
  reference ppVar6;
  ulong extraout_RDX;
  int unaff_EBX;
  int *in_RSI;
  ctrl_t *pcVar7;
  ctrl_t *pcVar8;
  ulong uVar9;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  ctrl_t cVar15;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  
  pcVar2 = this->ctrl_;
  if (pcVar2 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
    ::iterator::operator->((iterator *)this);
  }
  else if (pcVar2 != kEmptyGroup + 0x10) {
    if (kSentinel < *pcVar2) {
      ppVar6 = operator*(this);
      return ppVar6;
    }
    goto LAB_0061aeae;
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
  ::iterator::operator->((iterator *)this);
LAB_0061aeae:
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
  ::iterator::operator->((iterator *)this);
  pcVar2 = this->ctrl_;
  if (((ulong)(pcVar2 + 1) & (ulong)pcVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pcVar3 = this[1].ctrl_;
  pcVar8 = (ctrl_t *)(extraout_RDX >> 7 ^ (ulong)pcVar3 >> 0xc);
  auVar13 = ZEXT216(CONCAT11((char)extraout_RDX,(char)extraout_RDX) & 0x7f7f);
  auVar13 = pshuflw(auVar13,auVar13,0);
  pcVar7 = (ctrl_t *)0x0;
  do {
    uVar9 = (ulong)pcVar8 & (ulong)pcVar2;
    pcVar8 = pcVar3 + uVar9;
    cVar5 = pcVar8[0xf];
    cVar15 = auVar13[0];
    auVar16[0] = -(cVar15 == *pcVar8);
    cVar18 = auVar13[1];
    auVar16[1] = -(cVar18 == pcVar8[1]);
    cVar19 = auVar13[2];
    auVar16[2] = -(cVar19 == pcVar8[2]);
    cVar20 = auVar13[3];
    auVar16[3] = -(cVar20 == pcVar8[3]);
    auVar16[4] = -(cVar15 == pcVar8[4]);
    auVar16[5] = -(cVar18 == pcVar8[5]);
    auVar16[6] = -(cVar19 == pcVar8[6]);
    auVar16[7] = -(cVar20 == pcVar8[7]);
    auVar16[8] = -(cVar15 == pcVar8[8]);
    auVar16[9] = -(cVar18 == pcVar8[9]);
    auVar16[10] = -(cVar19 == pcVar8[10]);
    auVar16[0xb] = -(cVar20 == pcVar8[0xb]);
    auVar16[0xc] = -(cVar15 == pcVar8[0xc]);
    auVar16[0xd] = -(cVar18 == pcVar8[0xd]);
    auVar16[0xe] = -(cVar19 == pcVar8[0xe]);
    auVar16[0xf] = -(cVar20 == cVar5);
    uVar11 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar11;
    while (uVar11 != 0) {
      uVar4 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar12 = uVar4 + uVar9 & (ulong)pcVar2;
      psVar1 = this[1].field_1.slot_ + uVar12;
      auVar17._0_4_ = -(uint)(*(int *)psVar1 == *in_RSI);
      auVar17._4_4_ = -(uint)(*(int *)((long)&(psVar1->value).first.first + 4) == in_RSI[1]);
      auVar17._8_4_ = -(uint)(*(int *)&(psVar1->value).first.second == in_RSI[2]);
      auVar17._12_4_ = -(uint)(*(int *)((long)&(psVar1->value).first.second + 4) == in_RSI[3]);
      auVar21._4_4_ = auVar17._0_4_;
      auVar21._0_4_ = auVar17._4_4_;
      auVar21._8_4_ = auVar17._12_4_;
      auVar21._12_4_ = auVar17._8_4_;
      unaff_EBX = movmskpd(unaff_EBX,auVar21 & auVar17);
      if (unaff_EBX == 3) {
        if (pcVar3 != (ctrl_t *)0x0) {
          return (pointer)(pcVar3 + uVar12);
        }
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
                     );
      }
      uVar11 = (ushort)(uVar10 - 1) & (ushort)uVar10;
      uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar11);
    }
    auVar14[0] = -(*pcVar8 == kEmpty);
    auVar14[1] = -(pcVar8[1] == kEmpty);
    auVar14[2] = -(pcVar8[2] == kEmpty);
    auVar14[3] = -(pcVar8[3] == kEmpty);
    auVar14[4] = -(pcVar8[4] == kEmpty);
    auVar14[5] = -(pcVar8[5] == kEmpty);
    auVar14[6] = -(pcVar8[6] == kEmpty);
    auVar14[7] = -(pcVar8[7] == kEmpty);
    auVar14[8] = -(pcVar8[8] == kEmpty);
    auVar14[9] = -(pcVar8[9] == kEmpty);
    auVar14[10] = -(pcVar8[10] == kEmpty);
    auVar14[0xb] = -(pcVar8[0xb] == kEmpty);
    auVar14[0xc] = -(pcVar8[0xc] == kEmpty);
    auVar14[0xd] = -(pcVar8[0xd] == kEmpty);
    auVar14[0xe] = -(pcVar8[0xe] == kEmpty);
    auVar14[0xf] = -(cVar5 == kEmpty);
    if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == kEmpty) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                  *)this);
      return (pointer)0x0;
    }
    pcVar8 = pcVar7 + uVar9 + 0x10;
    pcVar7 = pcVar7 + 0x10;
  } while (pcVar7 <= pcVar2);
  __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe37,
                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>, K = std::pair<const void *, const void *>]"
               );
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }